

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [19],unsigned_long_long *params_1,unsigned_long_long *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<const_char> *params_00;
  unsigned_long_long *value;
  CappedArray<char,_26UL> *params_01;
  unsigned_long_long *value_00;
  CappedArray<char,_26UL> *params_02;
  long lVar4;
  String argValues [3];
  String *__return_storage_ptr__;
  undefined8 uVar5;
  CappedArray<char,_26UL> local_a0;
  String local_78;
  String local_60;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_a0.content._0_8_ = strlen(*params);
  local_a0.currentSize = (size_t)params;
  __return_storage_ptr__ = &local_78;
  concat<kj::ArrayPtr<char_const>>(__return_storage_ptr__,(_ *)&local_a0,params_00);
  toCharSequence<unsigned_long_long&>(&local_a0,(kj *)params_1,value);
  concat<kj::CappedArray<char,26ul>>(&local_60,(_ *)&local_a0,params_01);
  toCharSequence<unsigned_long_long&>(&local_a0,(kj *)params_2,value_00);
  concat<kj::CappedArray<char,26ul>>(&local_48,(_ *)&local_a0,params_02);
  uVar5 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,__return_storage_ptr__,uVar5);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}